

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O1

bool __thiscall
iDynTree::BerdyHelper::getBerdyMatrices
          (BerdyHelper *this,SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *D,VectorDynSize *bD,
          SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *Y,VectorDynSize *bY)

{
  BerdyVariants BVar1;
  bool bVar2;
  
  if (this->m_kinematicsUpdated == false) {
    iDynTree::reportError("BerdyHelpers","getBerdyMatrices","Kinematic information not set.");
    return false;
  }
  BVar1 = (this->m_options).berdyVariant;
  if (BVar1 == BERDY_FLOATING_BASE_NON_COLLOCATED_EXT_WRENCHES) {
    iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::resize
              ((ulong)D,this->m_nrOfDynamicEquations);
    iDynTree::VectorDynSize::resize((ulong)bD);
    iDynTree::Triplets::clear();
    iDynTree::VectorDynSize::zero();
  }
  else if (BVar1 == BERDY_FLOATING_BASE) {
    computeBerdyDynamicsMatricesFloatingBase(this,D,bD);
  }
  else {
    if (BVar1 != ORIGINAL_BERDY_FIXED_BASE) {
      iDynTree::reportError("BerdyHelpers","getBerdyMatrices","unknown berdy variant");
      bVar2 = false;
      goto LAB_001352d4;
    }
    computeBerdyDynamicsMatricesFixedBase(this,D,bD);
  }
  bVar2 = true;
LAB_001352d4:
  if (bVar2 != false) {
    computeBerdySensorMatrices(this,Y,bY);
  }
  return bVar2;
}

Assistant:

bool BerdyHelper::getBerdyMatrices(SparseMatrix<iDynTree::ColumnMajor>& D, VectorDynSize& bD,
                                   SparseMatrix<iDynTree::ColumnMajor>& Y, VectorDynSize& bY)
{
    if (!m_kinematicsUpdated)
    {
        reportError("BerdyHelpers","getBerdyMatrices",
                    "Kinematic information not set.");
        return false;
    }


    bool res = true;

    // Compute D matrix of dynamics equations
    switch(m_options.berdyVariant)
    {
    case ORIGINAL_BERDY_FIXED_BASE:
        res = res && computeBerdyDynamicsMatricesFixedBase(D, bD);
        break;
    case BERDY_FLOATING_BASE:
        res = res && computeBerdyDynamicsMatricesFloatingBase(D, bD);
        break;
    case BERDY_FLOATING_BASE_NON_COLLOCATED_EXT_WRENCHES:
        // D and bD are not used with this variant
        D.resize(m_nrOfDynamicEquations,m_nrOfDynamicalVariables);
        bD.resize(m_nrOfDynamicEquations);
        matrixDElements.clear();
        bD.zero();
        break;
    default:
        reportError("BerdyHelpers", "getBerdyMatrices", "unknown berdy variant");
        res = false;
    }

    // Compute Y matrix of sensors
    res = res && computeBerdySensorMatrices(Y, bY);

    return res;
}